

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O2

int run_test_timer_huge_timeout(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *__format;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_a;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&tiny_timer);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&huge_timer1);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      puVar2 = uv_default_loop();
      iVar1 = uv_timer_init(puVar2,&huge_timer2);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        iVar1 = uv_timer_start(&tiny_timer,tiny_timer_cb,1,0);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          iVar1 = uv_timer_start(&huge_timer1,tiny_timer_cb,0xffffffffffff,0);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            iVar1 = uv_timer_start(&huge_timer2,tiny_timer_cb,0xffffffffffffffff,0);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              eval_a = 1;
              eval_b = uv_timer_get_due_in(&tiny_timer);
              if (eval_b == 1) {
                eval_a = 0xffffffffffff;
                eval_b = uv_timer_get_due_in(&huge_timer1);
                if (eval_b == 0xffffffffffff) {
                  uv_timer_get_due_in(&huge_timer2);
                  puVar2 = uv_default_loop();
                  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
                  eval_a = (int64_t)iVar1;
                  eval_b = 0;
                  if (eval_a == 0) {
                    puVar2 = uv_default_loop();
                    close_loop(puVar2);
                    eval_a = 0;
                    puVar2 = uv_default_loop();
                    iVar1 = uv_loop_close(puVar2);
                    eval_b = (int64_t)iVar1;
                    if (eval_b == 0) {
                      uv_library_shutdown();
                      return 0;
                    }
                    pcVar5 = "uv_loop_close(uv_default_loop())";
                    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
                    pcVar4 = "0";
                    uVar3 = 0x125;
                  }
                  else {
                    pcVar5 = "0";
                    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
                    pcVar4 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
                    uVar3 = 0x124;
                  }
                }
                else {
                  pcVar5 = "uv_timer_get_due_in(&huge_timer1)";
                  __format = "Assertion failed in %s on line %d: `%s %s %s` (%lu %s %lu)\n";
                  pcVar4 = "281474976710655";
                  uVar3 = 0x122;
                }
              }
              else {
                pcVar5 = "uv_timer_get_due_in(&tiny_timer)";
                __format = "Assertion failed in %s on line %d: `%s %s %s` (%lu %s %lu)\n";
                pcVar4 = "1";
                uVar3 = 0x121;
              }
            }
            else {
              pcVar5 = "0";
              __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
              pcVar4 = "uv_timer_start(&huge_timer2, tiny_timer_cb, (uint64_t) -1, 0)";
              uVar3 = 0x120;
            }
          }
          else {
            pcVar5 = "0";
            __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
            pcVar4 = "uv_timer_start(&huge_timer1, tiny_timer_cb, 0xffffffffffffLL, 0)";
            uVar3 = 0x11f;
          }
        }
        else {
          pcVar5 = "0";
          __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
          pcVar4 = "uv_timer_start(&tiny_timer, tiny_timer_cb, 1, 0)";
          uVar3 = 0x11b;
        }
      }
      else {
        pcVar5 = "0";
        __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
        pcVar4 = "uv_timer_init(uv_default_loop(), &huge_timer2)";
        uVar3 = 0x11a;
      }
    }
    else {
      pcVar5 = "0";
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
      pcVar4 = "uv_timer_init(uv_default_loop(), &huge_timer1)";
      uVar3 = 0x119;
    }
  }
  else {
    pcVar5 = "0";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar4 = "uv_timer_init(uv_default_loop(), &tiny_timer)";
    uVar3 = 0x118;
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(timer_huge_timeout) {
  ASSERT_OK(uv_timer_init(uv_default_loop(), &tiny_timer));
  ASSERT_OK(uv_timer_init(uv_default_loop(), &huge_timer1));
  ASSERT_OK(uv_timer_init(uv_default_loop(), &huge_timer2));
  ASSERT_OK(uv_timer_start(&tiny_timer, tiny_timer_cb, 1, 0));
  ASSERT_OK(uv_timer_start(&huge_timer1,
                           tiny_timer_cb,
                           0xffffffffffffLL,
                           0));
  ASSERT_OK(uv_timer_start(&huge_timer2, tiny_timer_cb, (uint64_t) -1, 0));
  ASSERT_UINT64_EQ(1, uv_timer_get_due_in(&tiny_timer));
  ASSERT_UINT64_EQ(281474976710655, uv_timer_get_due_in(&huge_timer1));
  ASSERT_UINT64_LE(0, uv_timer_get_due_in(&huge_timer2));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}